

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fNegativeTextureApiTests.cpp
# Opt level: O2

deUint32 deqp::gles3::Functional::cubeFaceToGLFace(CubeFace face)

{
  deUint32 dVar1;
  
  dVar1 = 0;
  if (face < CUBEFACE_LAST) {
    dVar1 = *(deUint32 *)(&DAT_01856c54 + (ulong)face * 4);
  }
  return dVar1;
}

Assistant:

static deUint32 cubeFaceToGLFace (tcu::CubeFace face)
{
	switch (face)
	{
		case tcu::CUBEFACE_NEGATIVE_X: return GL_TEXTURE_CUBE_MAP_NEGATIVE_X;
		case tcu::CUBEFACE_POSITIVE_X: return GL_TEXTURE_CUBE_MAP_POSITIVE_X;
		case tcu::CUBEFACE_NEGATIVE_Y: return GL_TEXTURE_CUBE_MAP_NEGATIVE_Y;
		case tcu::CUBEFACE_POSITIVE_Y: return GL_TEXTURE_CUBE_MAP_POSITIVE_Y;
		case tcu::CUBEFACE_NEGATIVE_Z: return GL_TEXTURE_CUBE_MAP_NEGATIVE_Z;
		case tcu::CUBEFACE_POSITIVE_Z: return GL_TEXTURE_CUBE_MAP_POSITIVE_Z;
		default:
			DE_ASSERT(DE_FALSE);
			return GL_NONE;
	}
}